

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

int qt_qpixmapcache_qpixmapcache_total_used(void)

{
  bool bVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pm_cache>_> *in_RAX;
  Type *pTVar2;
  qsizetype qVar3;
  int iVar4;
  
  bVar1 = qt_pixmapcache_thread_test();
  if (bVar1) {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pm_cache>_>::
             operator()(in_RAX);
    qVar3 = QCache<QPixmapCache::Key,_QPixmapCacheEntry>::totalCost
                      (&pTVar2->super_QCache<QPixmapCache::Key,_QPixmapCacheEntry>);
    iVar4 = (int)((qVar3 + 0x3ff) / 0x400);
  }
  else {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

Q_AUTOTEST_EXPORT int qt_qpixmapcache_qpixmapcache_total_used() // for tst_qpixmapcache
{
    if (!qt_pixmapcache_thread_test())
        return 0;
    return (pm_cache()->totalCost()+1023) / 1024;
}